

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O2

void gdImageFlipHorizontal(gdImagePtr im)

{
  uchar uVar1;
  int iVar2;
  int *piVar3;
  uchar *puVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  if (im->trueColor == 0) {
    for (lVar5 = 0; lVar5 < im->sy; lVar5 = lVar5 + 1) {
      puVar4 = im->pixels[lVar5];
      uVar8 = (ulong)im->sx;
      uVar6 = uVar8;
      for (lVar7 = 0; uVar6 = uVar6 - 1, (int)lVar7 < (int)uVar8 >> 1; lVar7 = lVar7 + 1) {
        uVar1 = puVar4[lVar7];
        puVar4[lVar7] = puVar4[uVar6];
        puVar4[uVar6] = uVar1;
        uVar8 = (ulong)(uint)im->sx;
      }
    }
  }
  else {
    for (lVar5 = 0; lVar5 < im->sy; lVar5 = lVar5 + 1) {
      piVar3 = im->tpixels[lVar5];
      uVar8 = (ulong)im->sx;
      uVar6 = uVar8;
      for (lVar7 = 0; uVar6 = uVar6 - 1, (int)lVar7 < (int)uVar8 >> 1; lVar7 = lVar7 + 1) {
        iVar2 = piVar3[lVar7];
        piVar3[lVar7] = piVar3[uVar6];
        piVar3[uVar6] = iVar2;
        uVar8 = (ulong)(uint)im->sx;
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipHorizontal(gdImagePtr im)
{

	int x, y;

	if (im->trueColor) {
		int *px1, *px2, tmp;

		for (y = 0; y < im->sy; y++) {
			px1 = im->tpixels[y];
			px2 = im->tpixels[y] + im->sx - 1;
			for (x = 0; x < (im->sx >> 1); x++) {
				tmp = *px1;
				*px1 = *px2;
				*px2 = tmp;
				px1++;
				px2--;
			}
		}
	} else {
		unsigned char *px1, *px2, tmp;

		for (y = 0; y < im->sy; y++) {
			px1 = im->pixels[y];
			px2 = im->pixels[y] + im->sx - 1;
			for (x = 0; x < (im->sx >> 1); x++) {
				tmp = *px1;
				*px1 = *px2;
				*px2 = tmp;
				px1++;
				px2--;
			}
		}
	}
}